

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O1

void uhttp_client_close(HTTP_CLIENT_HANDLE handle,ON_HTTP_CLOSED_CALLBACK on_close_callback,
                       void *callback_ctx)

{
  HTTP_HEADERS_HANDLE handle_00;
  BUFFER_HANDLE handle_01;
  LIST_ITEM_HANDLE item_handle;
  void *__ptr;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  
  if ((handle != (HTTP_CLIENT_HANDLE)0x0) && (1 < (handle->recv_msg).recv_state - state_closing)) {
    handle->on_close_callback = on_close_callback;
    handle->close_user_ctx = callback_ctx;
    xio_close(handle->xio_handle,on_xio_close_complete,handle);
    item_handle = singlylinkedlist_get_head_item(handle->data_list);
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      __ptr = singlylinkedlist_item_get_value(item_handle);
      if (__ptr != (void *)0x0) {
        STRING_delete(*(STRING_HANDLE *)((long)__ptr + 8));
        BUFFER_delete(*(BUFFER_HANDLE *)((long)__ptr + 0x18));
        STRING_delete(*(STRING_HANDLE *)((long)__ptr + 0x10));
        free(__ptr);
      }
      singlylinkedlist_remove(handle->data_list,item_handle);
      item_handle = singlylinkedlist_get_head_item(handle->data_list);
    }
    (handle->recv_msg).status_code = 0;
    (handle->recv_msg).recv_state = state_closed;
    (handle->recv_msg).total_body_len = 0;
    free(handle->host_name);
    handle->host_name = (char *)0x0;
    handle_00 = (handle->recv_msg).resp_header;
    if (handle_00 != (HTTP_HEADERS_HANDLE)0x0) {
      HTTPHeaders_Free(handle_00);
      (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
    }
    handle_01 = (handle->recv_msg).msg_body;
    if (handle_01 != (BUFFER_HANDLE)0x0) {
      BUFFER_delete(handle_01);
      (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
    }
  }
  return;
}

Assistant:

void uhttp_client_close(HTTP_CLIENT_HANDLE handle, ON_HTTP_CLOSED_CALLBACK on_close_callback, void* callback_ctx)
{
    HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;
    /* Codes_SRS_UHTTP_07_009: [If handle is NULL then http_client_close shall do nothing] */
    /* Codes_SRS_UHTTP_07_049: [ If the state has been previously set to state_closed, uhttp_client_close shall do nothing. ] */
    if (http_data != NULL && http_data->recv_msg.recv_state != state_closed && http_data->recv_msg.recv_state != state_closing)
    {
        http_data->on_close_callback = on_close_callback;
        http_data->close_user_ctx = callback_ctx;
        /* Codes_SRS_UHTTP_07_010: [If the xio_handle is NOT NULL http_client_close shall call xio_close to close the handle] */
        (void)xio_close(http_data->xio_handle, on_xio_close_complete, http_data);

        LIST_ITEM_HANDLE pending_list_item;
        while ((pending_list_item = singlylinkedlist_get_head_item(http_data->data_list)) != NULL)
        {
            HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)singlylinkedlist_item_get_value(pending_list_item);
            if (send_data != NULL)
            {
                STRING_delete(send_data->relative_path);
                BUFFER_delete(send_data->content);
                STRING_delete(send_data->header_line);
                free(send_data);
            }
            singlylinkedlist_remove(http_data->data_list, pending_list_item);
        }

        http_data->recv_msg.status_code = 0;
        http_data->recv_msg.recv_state = state_closed;
        http_data->recv_msg.total_body_len = 0;
        free(http_data->host_name);
        http_data->host_name = NULL;

        /* Codes_SRS_UHTTP_07_011: [http_client_close shall free any HTTPHeader object that has not been freed] */
        if (http_data->recv_msg.resp_header != NULL)
        {
            HTTPHeaders_Free(http_data->recv_msg.resp_header);
            http_data->recv_msg.resp_header = NULL;
        }
        if (http_data->recv_msg.msg_body != NULL)
        {
            BUFFER_delete(http_data->recv_msg.msg_body);
            http_data->recv_msg.msg_body = NULL;
        }
    }
}